

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O1

void ImGui::OpenPopupEx(char *str_id,bool reopen_existing)

{
  int *piVar1;
  float fVar2;
  float fVar3;
  int iVar4;
  ImGuiWindow *this;
  ImGuiContext *pIVar5;
  ImGuiContext *pIVar6;
  ImGuiID IVar7;
  ImGuiID IVar8;
  ImGuiPopupRef *pIVar9;
  int iVar10;
  ImGuiPopupRef *pIVar11;
  int iVar12;
  int iVar13;
  
  pIVar5 = GImGui;
  this = GImGui->CurrentWindow;
  IVar7 = ImGuiWindow::GetID(this,str_id,(char *)0x0);
  iVar12 = (pIVar5->CurrentPopupStack).Size;
  IVar8 = ImGuiWindow::GetID(this,"##menus",(char *)0x0);
  pIVar6 = GImGui;
  fVar2 = (pIVar5->IO).MousePos.x;
  fVar3 = (pIVar5->IO).MousePos.y;
  iVar4 = (pIVar5->OpenPopupStack).Size;
  if (iVar12 < iVar4) {
    if ((!reopen_existing) && ((pIVar5->OpenPopupStack).Data[iVar12].PopupId == IVar7)) {
      return;
    }
    iVar4 = iVar12 + 1;
    iVar10 = (pIVar5->OpenPopupStack).Capacity;
    if (iVar10 <= iVar12) {
      if (iVar10 == 0) {
        iVar13 = 8;
      }
      else {
        iVar13 = iVar10 / 2 + iVar10;
      }
      if (iVar13 <= iVar4) {
        iVar13 = iVar4;
      }
      if (iVar10 < iVar13) {
        piVar1 = &(GImGui->IO).MetricsAllocs;
        *piVar1 = *piVar1 + 1;
        pIVar9 = (ImGuiPopupRef *)(*(pIVar6->IO).MemAllocFn)((long)iVar13 * 0x28);
        pIVar11 = (pIVar5->OpenPopupStack).Data;
        if (pIVar11 != (ImGuiPopupRef *)0x0) {
          memcpy(pIVar9,pIVar11,(long)(pIVar5->OpenPopupStack).Size * 0x28);
        }
        pIVar11 = (pIVar5->OpenPopupStack).Data;
        if (pIVar11 != (ImGuiPopupRef *)0x0) {
          piVar1 = &(GImGui->IO).MetricsAllocs;
          *piVar1 = *piVar1 + -1;
        }
        (*(GImGui->IO).MemFreeFn)(pIVar11);
        (pIVar5->OpenPopupStack).Data = pIVar9;
        (pIVar5->OpenPopupStack).Capacity = iVar13;
      }
    }
    (pIVar5->OpenPopupStack).Size = iVar4;
    pIVar11 = (pIVar5->OpenPopupStack).Data;
  }
  else {
    iVar12 = (pIVar5->OpenPopupStack).Capacity;
    if (iVar4 == iVar12) {
      if (iVar12 == 0) {
        iVar10 = 8;
      }
      else {
        iVar10 = iVar12 / 2 + iVar12;
      }
      iVar13 = iVar4 + 1;
      if (iVar4 + 1 < iVar10) {
        iVar13 = iVar10;
      }
      if (iVar12 < iVar13) {
        piVar1 = &(GImGui->IO).MetricsAllocs;
        *piVar1 = *piVar1 + 1;
        pIVar9 = (ImGuiPopupRef *)(*(pIVar6->IO).MemAllocFn)((long)iVar13 * 0x28);
        pIVar11 = (pIVar5->OpenPopupStack).Data;
        if (pIVar11 != (ImGuiPopupRef *)0x0) {
          memcpy(pIVar9,pIVar11,(long)(pIVar5->OpenPopupStack).Size * 0x28);
        }
        pIVar11 = (pIVar5->OpenPopupStack).Data;
        if (pIVar11 != (ImGuiPopupRef *)0x0) {
          piVar1 = &(GImGui->IO).MetricsAllocs;
          *piVar1 = *piVar1 + -1;
        }
        (*(GImGui->IO).MemFreeFn)(pIVar11);
        (pIVar5->OpenPopupStack).Data = pIVar9;
        (pIVar5->OpenPopupStack).Capacity = iVar13;
      }
    }
    pIVar11 = (pIVar5->OpenPopupStack).Data;
    iVar12 = (pIVar5->OpenPopupStack).Size;
    (pIVar5->OpenPopupStack).Size = iVar12 + 1;
  }
  pIVar11[iVar12].PopupId = IVar7;
  pIVar11[iVar12].Window = (ImGuiWindow *)0x0;
  pIVar11[iVar12].ParentWindow = this;
  pIVar11[iVar12].ParentMenuSet = IVar8;
  pIVar11[iVar12].MousePosOnOpen.x = fVar2;
  pIVar11[iVar12].MousePosOnOpen.y = fVar3;
  return;
}

Assistant:

void ImGui::OpenPopupEx(const char* str_id, bool reopen_existing)
{
    ImGuiContext& g = *GImGui;
    ImGuiWindow* window = g.CurrentWindow;
    ImGuiID id = window->GetID(str_id);
    int current_stack_size = g.CurrentPopupStack.Size;
    ImGuiPopupRef popup_ref = ImGuiPopupRef(id, window, window->GetID("##menus"), g.IO.MousePos); // Tagged as new ref because constructor sets Window to NULL (we are passing the ParentWindow info here)
    if (g.OpenPopupStack.Size < current_stack_size + 1)
        g.OpenPopupStack.push_back(popup_ref);
    else if (reopen_existing || g.OpenPopupStack[current_stack_size].PopupId != id)
    {
        g.OpenPopupStack.resize(current_stack_size+1);
        g.OpenPopupStack[current_stack_size] = popup_ref;
    }
}